

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filenames.cc
# Opt level: O1

string_view __thiscall wabt::GetBasename(wabt *this,string_view filename)

{
  char *pcVar1;
  wabt *pwVar2;
  wabt *pwVar3;
  wabt *pwVar4;
  char *pcVar5;
  bool bVar6;
  string_view sVar7;
  
  pcVar5 = (char *)filename._M_len;
  pwVar2 = (wabt *)0xffffffffffffffff;
  pwVar4 = this;
  if (this != (wabt *)0x0) {
    do {
      pwVar2 = pwVar4 + -1;
      if (pwVar4 == (wabt *)0x0) {
        pwVar2 = (wabt *)0xffffffffffffffff;
        break;
      }
      pcVar1 = pcVar5 + -1 + (long)pwVar4;
      pwVar4 = pwVar2;
    } while (*pcVar1 != '/');
  }
  pwVar4 = this;
  if (this == (wabt *)0x0) {
LAB_0012f136:
    pwVar3 = (wabt *)0xffffffffffffffff;
  }
  else {
    do {
      pwVar3 = pwVar4 + -1;
      if (pwVar4 == (wabt *)0x0) goto LAB_0012f136;
      pcVar1 = pcVar5 + -1 + (long)pwVar4;
      pwVar4 = pwVar3;
    } while (*pcVar1 != '\\');
  }
  if (((ulong)pwVar3 & (ulong)pwVar2) != 0xffffffffffffffff) {
    if (pwVar2 == (wabt *)0xffffffffffffffff) {
      pwVar4 = pwVar3;
      if (pwVar3 == (wabt *)0xffffffffffffffff) goto LAB_0012f17a;
    }
    else {
      pwVar4 = pwVar2;
      if ((pwVar3 != (wabt *)0xffffffffffffffff) && (pwVar4 = pwVar3, pwVar3 < pwVar2)) {
        pwVar4 = pwVar2;
      }
    }
    pwVar4 = pwVar4 + 1;
    bVar6 = this < pwVar4;
    this = this + -(long)pwVar4;
    if (bVar6) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
    }
    pcVar5 = pcVar5 + (long)pwVar4;
  }
LAB_0012f17a:
  sVar7._M_str = pcVar5;
  sVar7._M_len = (size_t)this;
  return sVar7;
}

Assistant:

std::string_view GetBasename(std::string_view filename) {
  size_t last_slash = filename.find_last_of('/');
  size_t last_backslash = filename.find_last_of('\\');
  if (last_slash == std::string_view::npos &&
      last_backslash == std::string_view::npos) {
    return filename;
  }

  if (last_slash == std::string_view::npos) {
    if (last_backslash == std::string_view::npos) {
      return filename;
    }
    last_slash = last_backslash;
  } else if (last_backslash != std::string_view::npos) {
    last_slash = std::max(last_slash, last_backslash);
  }

  return filename.substr(last_slash + 1);
}